

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraphPath.cc
# Opt level: O1

string * __thiscall
SequenceDistanceGraphPath::sequence_abi_cxx11_
          (string *__return_storage_ptr__,SequenceDistanceGraphPath *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer plVar2;
  pointer pNVar3;
  long lVar4;
  pointer pvVar5;
  pointer pLVar6;
  pointer pcVar7;
  ostream *poVar8;
  pointer pLVar9;
  runtime_error *prVar10;
  char cVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long *n_1;
  long *n;
  pointer plVar15;
  long *plVar16;
  vector<long,_std::allocator<long>_> *__range2;
  long *plVar17;
  string nseq;
  value_type rcn;
  undefined1 *local_170;
  undefined8 local_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  SequenceDistanceGraphPath *local_148;
  long *local_140;
  Node local_138 [4];
  
  poVar8 = sdglib::OutputLog(DEBUG,true);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"sequence for a SequenceDistanceGraphPath with nodes = [",0x37);
  if (sdglib::OutputLogLevel == 2) {
    plVar2 = (this->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (plVar15 = (this->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start; plVar15 != plVar2; plVar15 = plVar15 + 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::ostream::_M_insert<long>((long)&std::cout);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ]",2);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  local_150 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  plVar16 = (this->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start;
  plVar17 = (this->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (plVar16 != plVar17) {
    lVar13 = 0;
    local_148 = this;
    local_140 = plVar17;
    do {
      local_170 = &local_160;
      local_168 = 0;
      local_160 = 0;
      if (*plVar16 < 1) {
        lVar14 = *plVar16;
        pNVar3 = (this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar1 = &local_138[0].sequence.field_2;
        lVar4 = *(long *)&pNVar3[-lVar14].sequence._M_dataplus;
        local_138[0].sequence._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_138,lVar4,pNVar3[-lVar14].sequence._M_string_length + lVar4);
        local_138[0].support.id = pNVar3[-lVar14].support.id;
        local_138[0].status = pNVar3[-lVar14].status;
        local_138[0]._33_7_ = *(undefined7 *)&pNVar3[-lVar14].field_0x21;
        pNVar3 = pNVar3 + -lVar14;
        local_138[0].support.type = (pNVar3->support).type;
        local_138[0].support._1_1_ = (pNVar3->support).field_0x1;
        local_138[0].support.index = (pNVar3->support).index;
        local_138[0].support._4_4_ = *(undefined4 *)&(pNVar3->support).field_0x4;
        Node::make_rc(local_138);
        std::__cxx11::string::_M_assign((string *)&local_170);
        plVar17 = local_140;
        this = local_148;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138[0].sequence._M_dataplus._M_p != paVar1) {
          operator_delete(local_138[0].sequence._M_dataplus._M_p,
                          local_138[0].sequence.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_170);
      }
      if (lVar13 != 0) {
        lVar14 = -lVar13;
        if (0 < lVar13) {
          lVar14 = lVar13;
        }
        pvVar5 = (this->sg->super_DistanceGraph).links.
                 super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pLVar6 = *(pointer *)
                  ((long)&pvVar5[lVar14].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                          super__Vector_impl_data + 8);
        for (pLVar9 = pvVar5[lVar14].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                      super__Vector_impl_data._M_start;
            (pLVar9 != pLVar6 && ((pLVar9->source != lVar13 || (pLVar9->dest != *plVar16))));
            pLVar9 = pLVar9 + 1) {
        }
        if (pLVar9 == pLVar6) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"can\'t find a link between ",0x1a);
          poVar8 = std::ostream::_M_insert<long>((long)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," and ",5);
          poVar8 = std::ostream::_M_insert<long>((long)poVar8);
          std::endl<char,std::char_traits<char>>(poVar8);
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar10,"path has no link");
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar13 = (long)pLVar9->dist;
        if (lVar13 < 1) {
          pcVar7 = (__return_storage_ptr__->_M_dataplus)._M_p;
          cVar11 = pcVar7[lVar13 + __return_storage_ptr__->_M_string_length];
          if (cVar11 != '\0') {
            lVar14 = 0;
            do {
              if (cVar11 != local_170[lVar14]) {
                sprintf((char *)local_138,"path overlap is invalid! (%d,%d,%d)",pLVar9->source,
                        pLVar9->dest,(ulong)(uint)pLVar9->dist);
                prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar10,(char *)local_138);
                __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              cVar11 = pcVar7[lVar14 + __return_storage_ptr__->_M_string_length + lVar13 + 1];
              lVar14 = lVar14 + 1;
            } while (cVar11 != '\0');
          }
          std::__cxx11::string::erase((ulong)&local_170,0);
        }
        else {
          iVar12 = pLVar9->dist + 1;
          do {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            iVar12 = iVar12 + -1;
          } while (1 < iVar12);
        }
      }
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_170);
      lVar13 = -*plVar16;
      if (local_170 != &local_160) {
        operator_delete(local_170,CONCAT71(uStack_15f,local_160) + 1);
      }
      plVar16 = plVar16 + 1;
    } while (plVar16 != plVar17);
  }
  poVar8 = sdglib::OutputLog(DEBUG,true);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"sequence finished successfully for SequenceDistanceGraphPath with nodes = [",
             0x4b);
  if (sdglib::OutputLogLevel == 2) {
    plVar2 = (this->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (plVar15 = (this->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start; plVar15 != plVar2; plVar15 = plVar15 + 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::ostream::_M_insert<long>((long)&std::cout);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ]",2);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SequenceDistanceGraphPath::sequence() const {
    sdglib::OutputLog(sdglib::LogLevels::DEBUG) << "sequence for a SequenceDistanceGraphPath with nodes = [" ;
    if(sdglib::OutputLogLevel == sdglib::LogLevels::DEBUG) {
        for(auto &n:nodes) std::cout << " " << n;
        std::cout << " ]" << std::endl;
    }
    std::string s = "";
    sgNodeID_t pnode = 0;
    // just iterate over every node in path - contig names are converted to ids at construction
    for (auto &n:nodes) {
        std::string nseq;
        if (n>0){
            nseq = sg.nodes[n].sequence;
        } else {
            auto rcn = sg.nodes[-n];
            rcn.make_rc();
            nseq = rcn.sequence;
        }
        if (pnode !=0){
            //find link between pnode' output (+pnode) and n's sink (-n)
            auto l=sg.links[(pnode>0 ? pnode:-pnode)].begin();
            for (;l!=sg.links[(pnode>0 ? pnode:-pnode)].end();++l)
                if (l->source==pnode and l->dest==n) break;
            if (l==sg.links[(pnode>0 ? pnode:-pnode)].end()) {
                std::cout<<"can't find a link between "<<pnode<<" and "<<n<<std::endl;
                throw std::runtime_error("path has no link");
            } else {
                if (l->dist > 0){
                    for (auto c = l->dist; c > 0; --c) s += "N";
                }
                else {
                    auto ovl =- l->dist;
                    for (auto s1 = s.c_str() + s.size() - ovl, s2 = nseq.c_str(); *s1 != NULL; ++s1, ++s2)
                        if (*s1 != *s2) {
                            char buffer[250];
                            sprintf(buffer,"path overlap is invalid! (%d,%d,%d)",l->source,l->dest,l->dist);
                            throw std::runtime_error(buffer);
                        }
                    nseq.erase(0, ovl);
                }
            }
        }
        s+=nseq;
        pnode=-n;
    }
    sdglib::OutputLog(sdglib::LogLevels::DEBUG) << "sequence finished successfully for SequenceDistanceGraphPath with nodes = [" ;
    if(sdglib::OutputLogLevel == sdglib::LogLevels::DEBUG) {
        for(auto &n:nodes) std::cout<<" "<<n;
        std::cout<<" ]"<<std::endl;
    }
    return s;
}